

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall EOPlus::Context::SetState(Context *this,string *state,bool do_actions)

{
  Quest *pQVar1;
  bool bVar2;
  const_iterator cVar3;
  Runtime_Error *this_00;
  string state_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  util::lowercase(&state_id,state);
  std::__cxx11::string::_M_assign((string *)&this->state_name);
  bVar2 = std::operator==(&state_id,"end");
  if (!bVar2) {
    bVar2 = std::operator==(&state_id,"done");
    if (!bVar2) goto LAB_0012bd50;
  }
  this->state = (State *)0x0;
  this->finished = true;
LAB_0012bd50:
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>_>
          ::find(&(this->quest->states)._M_t,&state_id);
  pQVar1 = this->quest;
  bVar2 = std::operator==(&state_id,"end");
  if ((_Rb_tree_header *)cVar3._M_node == &(pQVar1->states)._M_t._M_impl.super__Rb_tree_header) {
    if (!bVar2) {
      bVar2 = std::operator==(&state_id,"done");
      if (!bVar2) {
        this_00 = (Runtime_Error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_48,"Unknown quest state: ",&state_id);
        Runtime_Error::Runtime_Error(this_00,&local_48);
        __cxa_throw(this_00,&Runtime_Error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    this->finished = bVar2;
    this->state = (State *)(cVar3._M_node + 2);
    (**this->_vptr_Context)(this,state,(State *)(cVar3._M_node + 2));
    if (do_actions) {
      DoActions(this);
    }
  }
  std::__cxx11::string::~string((string *)&state_id);
  return;
}

Assistant:

void Context::SetState(const std::string& state, bool do_actions)
	{
		std::string state_id = util::lowercase(state);

		this->state_name = state_id;

		if (state_id == "end" || state_id == "done")
		{
			this->state = 0;
			this->finished = true;
		}

		auto it = this->quest->states.find(state_id);

		if (it == this->quest->states.end())
		{
			if (state_id == "end" || state_id == "done")
				return;
			else
				throw Runtime_Error("Unknown quest state: " + state_id);
		}

		this->finished = (state_id == "end");
		this->state = &it->second;
		this->BeginState(state, *this->state);

		if (do_actions)
			this->DoActions();
	}